

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Range.cpp
# Opt level: O3

string * to_string_abi_cxx11_(string *__return_storage_ptr__,Range *range)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  ostream *poVar4;
  int iVar5;
  ostringstream ss;
  undefined1 auStack_1a8 [15];
  char local_199;
  long local_198 [2];
  undefined8 auStack_188 [12];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  iVar5 = range->cyl_begin;
  iVar1 = range->cyl_end;
  if ((iVar1 <= iVar5) || (range->head_end <= range->head_begin)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"All Tracks","");
    goto LAB_00165465;
  }
  if (iVar1 - iVar5 == 1) {
    poVar4 = (ostream *)local_198;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Cyl ",4);
    pcVar2 = CylStr(range->cyl_begin);
LAB_00165399:
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar2,sVar3);
    }
    pcVar2 = ", ";
  }
  else {
    if (iVar5 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Cyls ",5);
      pcVar2 = CylStr(range->cyl_begin);
      if (pcVar2 == (char *)0x0) {
        std::ios::clear((int)auStack_1a8 + (int)*(undefined8 *)(local_198[0] + -0x18) + 0x10);
      }
      else {
        sVar3 = strlen(pcVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar2,sVar3);
      }
      local_199 = '-';
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,&local_199,1)
      ;
      pcVar2 = CylStr(range->cyl_end + -1);
      goto LAB_00165399;
    }
    *(undefined8 *)((long)auStack_188 + *(long *)(local_198[0] + -0x18)) = 2;
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_198,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," Cyls",5);
    pcVar2 = " ";
  }
  if (range->head_end - range->head_begin == 1) {
    poVar4 = (ostream *)local_198;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," Head ",6);
    iVar5 = range->head_begin;
LAB_00165450:
    std::ostream::operator<<((ostream *)poVar4,iVar5);
  }
  else {
    if (range->head_begin != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198," Heads ",7);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_198,range->head_begin);
      local_199 = '-';
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_199,1);
      iVar5 = range->head_end + -1;
      goto LAB_00165450;
    }
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar2,sVar3);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_198,range->head_end);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," Heads",6);
  }
  std::__cxx11::stringbuf::str();
LAB_00165465:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const Range& range)
{
    std::ostringstream ss;
    auto separator = ", ";

    if (range.empty())
        return "All Tracks";

    if (range.cyls() == 1)
        ss << "Cyl " << CylStr(range.cyl_begin);
    else if (range.cyl_begin == 0)
    {
        ss << std::setw(2) << range.cyl_end << " Cyls";
        separator = " ";
    }
    else
        ss << "Cyls " << CylStr(range.cyl_begin) << '-' << CylStr(range.cyl_end - 1);

    if (range.heads() == 1)
        ss << " Head " << range.head_begin;
    else if (range.head_begin == 0)
        ss << separator << range.head_end << " Heads";
    else
        ss << " Heads " << range.head_begin << '-' << (range.head_end - 1);

    return ss.str();
}